

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_info_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  size_t __size;
  uint uVar1;
  uchar *puVar2;
  ulong uVar3;
  size_t sVar4;
  uint i;
  long lVar5;
  
  lodepng_info_cleanup(dest);
  memcpy(dest,source,0xe8);
  (dest->color).key_defined = 0;
  (dest->color).key_r = 0;
  (dest->color).key_g = 0;
  (dest->color).key_b = 0;
  (dest->color).colortype = LCT_RGBA;
  (dest->color).bitdepth = 8;
  (dest->color).palette = (uchar *)0x0;
  (dest->color).palettesize = 0;
  uVar1 = lodepng_color_mode_copy(&dest->color,&source->color);
  if (uVar1 == 0) {
    dest->text_num = 0;
    dest->text_keys = (char **)0x0;
    dest->text_strings = (char **)0x0;
    if (source->text_num != 0) {
      sVar4 = 0;
      do {
        uVar1 = lodepng_add_text(dest,source->text_keys[sVar4],source->text_strings[sVar4]);
        if (uVar1 != 0) goto LAB_00109e5d;
        sVar4 = sVar4 + 1;
      } while (sVar4 != source->text_num);
    }
    uVar1 = 0;
LAB_00109e5d:
    if (uVar1 == 0) {
      dest->itext_langtags = (char **)0x0;
      dest->itext_transkeys = (char **)0x0;
      dest->itext_num = 0;
      dest->itext_keys = (char **)0x0;
      dest->itext_strings = (char **)0x0;
      if (source->itext_num != 0) {
        sVar4 = 0;
        do {
          uVar1 = lodepng_add_itext(dest,source->itext_keys[sVar4],source->itext_langtags[sVar4],
                                    source->itext_transkeys[sVar4],source->itext_strings[sVar4]);
          if (uVar1 != 0) goto LAB_00109ecb;
          sVar4 = sVar4 + 1;
        } while (sVar4 != source->itext_num);
      }
      uVar1 = 0;
LAB_00109ecb:
      if (uVar1 == 0) {
        dest->unknown_chunks_size[1] = 0;
        dest->unknown_chunks_size[2] = 0;
        dest->unknown_chunks_data[2] = (uchar *)0x0;
        dest->unknown_chunks_size[0] = 0;
        dest->unknown_chunks_data[0] = (uchar *)0x0;
        dest->unknown_chunks_data[1] = (uchar *)0x0;
        lVar5 = 0;
        do {
          free(dest->unknown_chunks_data[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar5 = 0;
        do {
          sVar4 = source->unknown_chunks_size[lVar5];
          dest->unknown_chunks_size[lVar5] = sVar4;
          __size = source->unknown_chunks_size[lVar5];
          puVar2 = (uchar *)malloc(__size);
          dest->unknown_chunks_data[lVar5] = puVar2;
          if (sVar4 != 0 && puVar2 == (uchar *)0x0) {
            return 0x53;
          }
          if (__size != 0) {
            uVar3 = 0;
            do {
              dest->unknown_chunks_data[lVar5][uVar3] = source->unknown_chunks_data[lVar5][uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar3 < source->unknown_chunks_size[lVar5]);
          }
          lVar5 = lVar5 + 1;
          uVar1 = 0;
        } while (lVar5 != 3);
      }
    }
  }
  return uVar1;
}

Assistant:

unsigned lodepng_info_copy(LodePNGInfo* dest, const LodePNGInfo* source)
{
  lodepng_info_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->color);
  CERROR_TRY_RETURN(lodepng_color_mode_copy(&dest->color, &source->color));

#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  CERROR_TRY_RETURN(LodePNGText_copy(dest, source));
  CERROR_TRY_RETURN(LodePNGIText_copy(dest, source));

  LodePNGUnknownChunks_init(dest);
  CERROR_TRY_RETURN(LodePNGUnknownChunks_copy(dest, source));
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  return 0;
}